

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameboard.cpp
# Opt level: O2

bool __thiscall GameBoard::containsAnXorAnO(GameBoard *this,Field *field)

{
  bool bVar1;
  bool bVar2;
  QArrayDataPointer<char16_t> QStack_48;
  QArrayDataPointer<char16_t> local_30;
  
  QAbstractButton::text();
  bVar1 = QString::operator==((QString *)&QStack_48,"X");
  bVar2 = true;
  if (!bVar1) {
    QAbstractButton::text();
    bVar2 = QString::operator==((QString *)&local_30,"O");
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_48);
  return bVar2;
}

Assistant:

bool GameBoard::containsAnXorAnO(Field *field)
{
    return field->text() == "X" || field->text() == "O";
}